

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  uint in_EDX;
  Slice *in_RSI;
  int *in_RDI;
  LRUHandle **ptr;
  Slice *in_stack_ffffffffffffffb8;
  Slice *x;
  bool local_32;
  bool local_31;
  LRUHandle **local_20;
  
  local_20 = (LRUHandle **)(*(long *)(in_RDI + 2) + (ulong)(in_EDX & *in_RDI - 1U) * 8);
  while( true ) {
    local_31 = false;
    if (*local_20 != (LRUHandle *)0x0) {
      local_32 = true;
      if ((*local_20)->hash == in_EDX) {
        x = in_RSI;
        LRUHandle::key((LRUHandle *)0x13c2e3);
        local_32 = operator!=(x,in_stack_ffffffffffffffb8);
      }
      local_31 = local_32;
    }
    if (local_31 == false) break;
    local_20 = &(*local_20)->next_hash;
  }
  return local_20;
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }